

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NtkSopTranspose(char *pSop,int nVars,Vec_Ptr_t *vCubes,Vec_Str_t *vStore)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  void **ppvVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong local_40;
  
  local_40 = (ulong)(uint)nVars;
  vCubes->nSize = 0;
  if (*pSop != '\0') {
    uVar9 = (ulong)(uint)vCubes->nCap;
    iVar7 = 0;
    do {
      iVar8 = (int)uVar9;
      if (iVar7 == iVar8) {
        if (iVar8 < 0x10) {
          if (vCubes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vCubes->pArray,0x80);
          }
          vCubes->pArray = ppvVar5;
          vCubes->nCap = 0x10;
          uVar9 = 0x10;
        }
        else {
          uVar9 = (ulong)(uint)(iVar8 * 2);
          if (vCubes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar9 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(vCubes->pArray,uVar9 * 8);
          }
          vCubes->pArray = ppvVar5;
          vCubes->nCap = iVar8 * 2;
        }
      }
      else {
        ppvVar5 = vCubes->pArray;
      }
      iVar8 = vCubes->nSize;
      iVar7 = iVar8 + 1;
      vCubes->nSize = iVar7;
      ppvVar5[iVar8] = pSop;
      pcVar6 = pSop + (nVars + 3);
      pSop = pSop + (nVars + 3);
    } while (*pcVar6 != '\0');
  }
  vStore->nSize = 0;
  if (nVars < 1) {
    vCubes->nSize = 0;
  }
  else {
    uVar9 = 0;
    do {
      if (0 < vCubes->nSize) {
        lVar10 = 0;
        do {
          cVar2 = *(char *)((long)vCubes->pArray[lVar10] + uVar9);
          uVar3 = vStore->nSize;
          if (uVar3 == vStore->nCap) {
            if ((int)uVar3 < 0x10) {
              if (vStore->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(vStore->pArray,0x10);
              }
              vStore->pArray = pcVar6;
              vStore->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar3 * 2;
              if (vStore->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar1);
              }
              else {
                pcVar6 = (char *)realloc(vStore->pArray,sVar1);
              }
              vStore->pArray = pcVar6;
              vStore->nCap = (int)sVar1;
            }
          }
          else {
            pcVar6 = vStore->pArray;
          }
          iVar7 = vStore->nSize;
          vStore->nSize = iVar7 + 1;
          pcVar6[iVar7] = cVar2;
          lVar10 = lVar10 + 1;
        } while (lVar10 < vCubes->nSize);
      }
      uVar3 = vStore->nSize;
      if (uVar3 == vStore->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vStore->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(0x10);
          }
          else {
            pcVar6 = (char *)realloc(vStore->pArray,0x10);
          }
          vStore->pArray = pcVar6;
          vStore->nCap = 0x10;
        }
        else {
          sVar1 = (ulong)uVar3 * 2;
          if (vStore->pArray == (char *)0x0) {
            pcVar6 = (char *)malloc(sVar1);
          }
          else {
            pcVar6 = (char *)realloc(vStore->pArray,sVar1);
          }
          vStore->pArray = pcVar6;
          vStore->nCap = (int)sVar1;
        }
      }
      else {
        pcVar6 = vStore->pArray;
      }
      iVar7 = vStore->nSize;
      vStore->nSize = iVar7 + 1;
      pcVar6[iVar7] = '\0';
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_40);
    iVar7 = vCubes->nSize;
    vCubes->nSize = 0;
    if (0 < nVars) {
      lVar10 = 0;
      iVar8 = 0;
      do {
        if ((lVar10 < 0) || (vStore->nSize <= lVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
        }
        pcVar6 = vStore->pArray;
        if (iVar8 == vCubes->nCap) {
          if (iVar8 < 0x10) {
            if (vCubes->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vCubes->pArray,0x80);
            }
            vCubes->pArray = ppvVar5;
            vCubes->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)(uint)(iVar8 * 2) * 8;
            if (vCubes->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(sVar1);
            }
            else {
              ppvVar5 = (void **)realloc(vCubes->pArray,sVar1);
            }
            vCubes->pArray = ppvVar5;
            vCubes->nCap = iVar8 * 2;
          }
        }
        else {
          ppvVar5 = vCubes->pArray;
        }
        iVar4 = vCubes->nSize;
        iVar8 = iVar4 + 1;
        vCubes->nSize = iVar8;
        ppvVar5[iVar4] = pcVar6 + lVar10;
        lVar10 = lVar10 + (long)iVar7 + 1;
        local_40 = local_40 - 1;
      } while (local_40 != 0);
    }
  }
  return;
}

Assistant:

void Abc_NtkSopTranspose( char * pSop, int nVars, Vec_Ptr_t * vCubes, Vec_Str_t * vStore )
{
    char * pCube; 
    int nCubes, v, c;
    // collect original cubes
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // rebuild the cubes
    Vec_StrClear( vStore );
    for ( v = 0; v < nVars; v++ )
    {
        Vec_PtrForEachEntry( char *, vCubes, pCube, c )
            Vec_StrPush( vStore, pCube[v] );
        Vec_StrPush( vStore, '\0' );
    }
    // get the cubes
    nCubes = Vec_PtrSize( vCubes );
    Vec_PtrClear( vCubes );
    for ( v = 0; v < nVars; v++ )
        Vec_PtrPush( vCubes, Vec_StrEntryP(vStore, v*(nCubes+1)) );
}